

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O3

int __thiscall
CVmObjVector::set_index_val_q
          (CVmObjVector *this,vm_val_t *new_container,vm_obj_id_t self,vm_val_t *index_val,
          vm_val_t *new_val)

{
  ushort uVar1;
  vm_obj_id_t vVar2;
  long lVar3;
  ulong new_ele_cnt;
  ulong uVar4;
  long lVar5;
  vm_val_t nil_val;
  vm_val_t local_40;
  
  if (index_val->typ == VM_INT) {
    vVar2 = (index_val->val).obj;
  }
  else {
    vVar2 = vm_val_t::nonint_num_to_int(index_val);
  }
  if (0 < (int)vVar2) {
    new_ele_cnt = (ulong)vVar2;
    uVar1 = *(ushort *)((this->super_CVmObjCollection).super_CVmObject.ext_ + 2);
    uVar4 = (ulong)uVar1;
    if (uVar1 < vVar2) {
      set_element_count_undo(this,self,new_ele_cnt);
      local_40.typ = VM_NIL;
      if (uVar4 < new_ele_cnt - 1) {
        lVar3 = uVar4 * 5 + 4;
        lVar5 = ~uVar4 + new_ele_cnt;
        do {
          vmb_put_dh((this->super_CVmObjCollection).super_CVmObject.ext_ + lVar3,&local_40);
          lVar3 = lVar3 + 5;
          lVar5 = lVar5 + -1;
        } while (lVar5 != 0);
      }
      vmb_put_dh((this->super_CVmObjCollection).super_CVmObject.ext_ + (ulong)(vVar2 - 1) * 5 + 4,
                 new_val);
    }
    else {
      set_element_undo(this,self,new_ele_cnt - 1,new_val);
    }
    new_container->typ = VM_OBJ;
    (new_container->val).obj = self;
    return 1;
  }
  err_throw(0x7df);
}

Assistant:

int CVmObjVector::set_index_val_q(VMG_ vm_val_t *new_container,
                                  vm_obj_id_t self,
                                  const vm_val_t *index_val,
                                  const vm_val_t *new_val)
{
    /* get the index value as an integer */
    int32_t idx = index_val->num_to_int(vmg0_);

    /* make sure it's at least 1 */
    if (idx < 1)
        err_throw(VMERR_INDEX_OUT_OF_RANGE);

    /* 
     *   if it's higher than the current length, extend the vector with nil
     *   entries to the requested size 
     */
    if ((uint32_t)idx > get_element_count())
    {
        size_t i;
        vm_val_t nil_val;
        
        /* note the first new element index */
        i = get_element_count();

        /* extend the vector */
        set_element_count_undo(vmg_ self, idx);

        /* 
         *   Fill in entries between the old length and the new length with
         *   nil.  Note that we don't have to fill in the very last element,
         *   since we'll explicitly set it to the new value momentarily
         *   anyway.  Note also that we don't need to keep undo for the
         *   initializations, since on undo we'll truncate the vector to
         *   remove the newly-added elements and thus won't need to restore
         *   any values for the slots.  
         */
        for (nil_val.set_nil() ; i < (size_t)idx - 1 ; ++i)
            set_element(i, &nil_val);

        /* 
         *   set the new value - this doesn't require undo since we had to
         *   expand the vector to make room for it 
         */
        set_element(idx - 1, new_val);
    }
    else
    {
        /* set the element and record undo, using a zero-based index */
        set_element_undo(vmg_ self, (size_t)idx - 1, new_val);
    }

    /* the result is the original vector value */
    new_container->set_obj(self);

    /* handled */
    return TRUE;
}